

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames.cpp
# Opt level: O2

void __thiscall
icu_63::TimeZoneNamesDelegate::TimeZoneNamesDelegate
          (TimeZoneNamesDelegate *this,Locale *locale,UErrorCode *status)

{
  int iVar1;
  char *__s;
  bool bVar2;
  TimeZoneNamesCacheEntry *value;
  TimeZoneNamesImpl *this_00;
  size_t sVar3;
  char *pcVar4;
  UHashElement *e;
  UDate UVar5;
  int32_t pos;
  Mutex lock;
  
  (this->super_TimeZoneNames).super_UObject._vptr_UObject =
       (_func_int **)&PTR__TimeZoneNamesDelegate_003d2b60;
  lock.fMutex = (UMutex *)gTimeZoneNamesLock;
  umtx_lock_63((UMutex *)gTimeZoneNamesLock);
  if (gTimeZoneNamesCacheInitialized == '\0') {
    gTimeZoneNamesCache =
         uhash_open_63(uhash_hashChars_63,uhash_compareChars_63,(undefined1 *)0x0,status);
    if (U_ZERO_ERROR < *status) goto LAB_0020ff8c;
    uhash_setKeyDeleter_63(gTimeZoneNamesCache,uprv_free_63);
    uhash_setValueDeleter_63(gTimeZoneNamesCache,deleteTimeZoneNamesCacheEntry);
    gTimeZoneNamesCacheInitialized = '\x01';
    ucln_i18n_registerCleanup_63(UCLN_I18N_TIMEZONENAMES,timeZoneNames_cleanup);
  }
  if (U_ZERO_ERROR < *status) goto LAB_0020ff8c;
  __s = locale->fullName;
  pcVar4 = __s;
  value = (TimeZoneNamesCacheEntry *)uhash_get_63(gTimeZoneNamesCache,__s);
  if (value == (TimeZoneNamesCacheEntry *)0x0) {
    this_00 = (TimeZoneNamesImpl *)UMemory::operator_new((UMemory *)0x140,(size_t)pcVar4);
    if (this_00 == (TimeZoneNamesImpl *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      TimeZoneNamesImpl::TimeZoneNamesImpl(this_00,locale,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        sVar3 = strlen(__s);
        pcVar4 = (char *)uprv_malloc_63(sVar3 + 1);
        if (pcVar4 == (char *)0x0) {
          pcVar4 = (char *)0x0;
LAB_0020fee3:
          *status = U_MEMORY_ALLOCATION_ERROR;
          goto LAB_0020feea;
        }
        strcpy(pcVar4,__s);
        if (U_ZERO_ERROR < *status) goto LAB_0020feea;
        value = (TimeZoneNamesCacheEntry *)uprv_malloc_63(0x18);
        if (value == (TimeZoneNamesCacheEntry *)0x0) goto LAB_0020fee3;
        value->names = (TimeZoneNames *)this_00;
        value->refCount = 1;
        UVar5 = uprv_getUTCtime_63();
        value->lastAccess = UVar5;
        uhash_put_63(gTimeZoneNamesCache,pcVar4,value,status);
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_0020ff14;
      }
      else {
        pcVar4 = (char *)0x0;
LAB_0020feea:
        value = (TimeZoneNamesCacheEntry *)0x0;
      }
      (*(this_00->super_TimeZoneNames).super_UObject._vptr_UObject[1])(this_00);
      if (pcVar4 != (char *)0x0) {
        uprv_free_63(pcVar4);
      }
      if (value != (TimeZoneNamesCacheEntry *)0x0) {
        uprv_free_63(value);
      }
    }
    value = (TimeZoneNamesCacheEntry *)0x0;
  }
  else {
    value->refCount = value->refCount + 1;
    UVar5 = uprv_getUTCtime_63();
    value->lastAccess = UVar5;
  }
LAB_0020ff14:
  iVar1 = gAccessCount + 1;
  bVar2 = 0x62 < gAccessCount;
  gAccessCount = iVar1;
  if (bVar2) {
    pos = -1;
    UVar5 = uprv_getUTCtime_63();
    while (e = uhash_nextElement_63(gTimeZoneNamesCache,&pos), e != (UHashElement *)0x0) {
      if ((*(int *)((long)(e->value).pointer + 8) < 1) &&
         (180000.0 < UVar5 - *(double *)((long)(e->value).pointer + 0x10))) {
        uhash_removeElement_63(gTimeZoneNamesCache,e);
      }
    }
    gAccessCount = 0;
  }
  this->fTZnamesCacheEntry = value;
LAB_0020ff8c:
  Mutex::~Mutex(&lock);
  return;
}

Assistant:

TimeZoneNamesDelegate::TimeZoneNamesDelegate(const Locale& locale, UErrorCode& status) {
    Mutex lock(&gTimeZoneNamesLock);
    if (!gTimeZoneNamesCacheInitialized) {
        // Create empty hashtable if it is not already initialized.
        gTimeZoneNamesCache = uhash_open(uhash_hashChars, uhash_compareChars, NULL, &status);
        if (U_SUCCESS(status)) {
            uhash_setKeyDeleter(gTimeZoneNamesCache, uprv_free);
            uhash_setValueDeleter(gTimeZoneNamesCache, deleteTimeZoneNamesCacheEntry);
            gTimeZoneNamesCacheInitialized = TRUE;
            ucln_i18n_registerCleanup(UCLN_I18N_TIMEZONENAMES, timeZoneNames_cleanup);
        }
    }

    if (U_FAILURE(status)) {
        return;
    }

    // Check the cache, if not available, create new one and cache
    TimeZoneNamesCacheEntry *cacheEntry = NULL;

    const char *key = locale.getName();
    cacheEntry = (TimeZoneNamesCacheEntry *)uhash_get(gTimeZoneNamesCache, key);
    if (cacheEntry == NULL) {
        TimeZoneNames *tznames = NULL;
        char *newKey = NULL;

        tznames = new TimeZoneNamesImpl(locale, status);
        if (tznames == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
        }
        if (U_SUCCESS(status)) {
            newKey = (char *)uprv_malloc(uprv_strlen(key) + 1);
            if (newKey == NULL) {
                status = U_MEMORY_ALLOCATION_ERROR;
            } else {
                uprv_strcpy(newKey, key);
            }
        }
        if (U_SUCCESS(status)) {
            cacheEntry = (TimeZoneNamesCacheEntry *)uprv_malloc(sizeof(TimeZoneNamesCacheEntry));
            if (cacheEntry == NULL) {
                status = U_MEMORY_ALLOCATION_ERROR;
            } else {
                cacheEntry->names = tznames;
                cacheEntry->refCount = 1;
                cacheEntry->lastAccess = (double)uprv_getUTCtime();

                uhash_put(gTimeZoneNamesCache, newKey, cacheEntry, &status);
            }
        }
        if (U_FAILURE(status)) {
            if (tznames != NULL) {
                delete tznames;
            }
            if (newKey != NULL) {
                uprv_free(newKey);
            }
            if (cacheEntry != NULL) {
                uprv_free(cacheEntry);
            }
            cacheEntry = NULL;
        }
    } else {
        // Update the reference count
        cacheEntry->refCount++;
        cacheEntry->lastAccess = (double)uprv_getUTCtime();
    }
    gAccessCount++;
    if (gAccessCount >= SWEEP_INTERVAL) {
        // sweep
        sweepCache();
        gAccessCount = 0;
    }
    fTZnamesCacheEntry = cacheEntry;
}